

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

void __thiscall jbcoin::Logs::threshold(Logs *this,Severity thresh)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  this->thresh_ = thresh;
  for (p_Var2 = (this->sinks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->sinks_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    (**(code **)(**(long **)(p_Var2 + 2) + 0x30))(*(long **)(p_Var2 + 2),thresh);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void
Logs::threshold (beast::severities::Severity thresh)
{
    std::lock_guard <std::mutex> lock (mutex_);
    thresh_ = thresh;
    for (auto& sink : sinks_)
        sink.second->threshold (thresh);
}